

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.c
# Opt level: O2

size_t utf8_line_length(utf8_char_t *data)

{
  size_t sVar1;
  size_t len;
  size_t sVar2;
  
  sVar2 = 0;
  while( true ) {
    if (data[sVar2] == '\0') {
      return sVar2;
    }
    sVar1 = _utf8_newline(data);
    if (sVar1 != 0) break;
    sVar1 = utf8_char_length(data);
    data = data + sVar1;
    sVar2 = sVar2 + 1;
  }
  return sVar2 + sVar1;
}

Assistant:

size_t utf8_line_length(const utf8_char_t* data)
{
    size_t n, len = 0;

    for (len = 0; 0 != data[len]; ++len) {
        if (0 < (n = _utf8_newline(data))) {
            return len + n;
        }

        data += utf8_char_length(data);
    }

    return len;
}